

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::Prim::Prim<tinyusdz::Model>(Prim *this,string *elementName,Model *prim)

{
  Model *prim_local;
  string *elementName_local;
  Prim *this_local;
  
  Path::Path(&this->_abs_path);
  Path::Path(&this->_path);
  Path::Path(&this->_elementPath);
  std::__cxx11::string::string((string *)&this->_prim_type_name);
  this->_specifier = Invalid;
  tinyusdz::value::Value::Value(&this->_data);
  std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::vector(&this->_children);
  std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::multiset(&this->_childrenNameSet);
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  std::vector<long,_std::allocator<long>_>::vector(&this->_primChildrenIndices);
  this->_prim_id = -1;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::map(&this->_variantSets);
  set_primdata<tinyusdz::Model>(this,elementName,prim);
  return;
}

Assistant:

Prim(const std::string &elementName, const T &prim) {
    set_primdata(elementName, prim);
  }